

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O3

void __thiscall DPlayerMenu::ColorSetChanged(DPlayerMenu *this,FListMenuItem *li)

{
  int iVar1;
  FListMenuItem *pFVar2;
  FListMenuItem *pFVar3;
  FListMenuItem *pFVar4;
  uint setnum;
  int sel;
  char command [24];
  int local_58;
  FName local_54;
  FName local_50;
  FName local_4c;
  char local_48 [32];
  
  iVar1 = (*li->_vptr_FListMenuItem[0xb])(li,0,&local_58);
  if ((char)iVar1 != '\0') {
    if ((long)local_58 < 1) {
      setnum = 0xffffffff;
    }
    else {
      setnum = (this->PlayerColorSets).Array[(long)local_58 + -1];
    }
    local_4c.Index = 0x205;
    pFVar2 = DListMenu::GetItem(&this->super_DListMenu,&local_4c);
    local_50.Index = 0x206;
    pFVar3 = DListMenu::GetItem(&this->super_DListMenu,&local_50);
    local_54.Index = 0x207;
    pFVar4 = DListMenu::GetItem(&this->super_DListMenu,&local_54);
    if (pFVar2 != (FListMenuItem *)0x0) {
      (*pFVar2->_vptr_FListMenuItem[0xc])(pFVar2,(ulong)(setnum == 0xffffffff));
    }
    if (pFVar3 != (FListMenuItem *)0x0) {
      (*pFVar3->_vptr_FListMenuItem[0xc])(pFVar3,(ulong)(setnum == 0xffffffff));
    }
    if (pFVar4 != (FListMenuItem *)0x0) {
      (*pFVar4->_vptr_FListMenuItem[0xc])(pFVar4,(ulong)(setnum == 0xffffffff));
    }
    userinfo_t::ColorSetChanged((userinfo_t *)(&DAT_017e1e78 + (long)consoleplayer * 0x54),setnum);
    mysnprintf(local_48,0x18,"colorset %d",(ulong)setnum);
    C_DoCommand(local_48,0);
    UpdateTranslation(this);
  }
  return;
}

Assistant:

void DPlayerMenu::ColorSetChanged (FListMenuItem *li)
{
	int	sel;

	if (li->GetValue(0, &sel))
	{
		int mycolorset = -1;

		if (sel > 0) mycolorset = PlayerColorSets[sel-1];

		FListMenuItem *red   = GetItem(NAME_Red);
		FListMenuItem *green = GetItem(NAME_Green);
		FListMenuItem *blue  = GetItem(NAME_Blue);

		// disable the sliders if a valid colorset is selected
		if (red != NULL) red->Enable(mycolorset == -1);
		if (green != NULL) green->Enable(mycolorset == -1);
		if (blue != NULL) blue->Enable(mycolorset == -1);

		char command[24];
		players[consoleplayer].userinfo.ColorSetChanged(mycolorset);
		mysnprintf(command, countof(command), "colorset %d", mycolorset);
		C_DoCommand(command);
		UpdateTranslation();
	}
}